

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathclipper.cpp
# Opt level: O0

bool anon_unknown.dwarf_d603ce::compare<((anonymous_namespace)::Edge)0>(QPointF *p,qreal t)

{
  QPointF *in_RDI;
  double in_XMM0_Qa;
  qreal qVar1;
  
  qVar1 = QPointF::x(in_RDI);
  return qVar1 < in_XMM0_Qa;
}

Assistant:

bool compare(const QPointF &p, qreal t)
{
    switch (edge)
    {
    case Left:
        return p.x() < t;
    case Right:
        return p.x() > t;
    case Top:
        return p.y() < t;
    default:
        return p.y() > t;
    }
}